

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::BinaryExpr<const_int_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_int_&,_const_int_&> *this,ostream *os)

{
  int *in_RSI;
  StringRef *in_RDI;
  string *in_stack_ffffffffffffff88;
  StringRef *in_stack_ffffffffffffff90;
  string *in_stack_ffffffffffffff98;
  ostream *in_stack_ffffffffffffffa0;
  StringRef local_48;
  string local_30 [48];
  
  Detail::stringify<int>(in_RSI);
  StringRef::StringRef(&local_48,in_RDI + 1);
  Detail::stringify<int>(in_RSI);
  formatReconstructedExpression
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             in_stack_ffffffffffffff88);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  StringRef::~StringRef(in_RDI);
  std::__cxx11::string::~string(local_30);
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }